

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O2

void __thiscall crnlib::qdxt5::optimize_selectors_task(qdxt5 *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  dxt_pixel_block *pdVar2;
  dxt5_block *pdVar3;
  bool bVar4;
  uint block_iter_1;
  uint uVar5;
  int iVar6;
  crn_thread_id_t cVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long *plVar13;
  uint64 total_error;
  ulong uVar14;
  ulong uVar15;
  uint block_iter;
  ulong uVar16;
  ulong uVar17;
  uint x;
  long lVar18;
  dxt5_block blk;
  vector<unsigned_int> block_categories [2];
  int local_88;
  uint block_index;
  
  block_categories[1].m_p = (uint *)0x0;
  block_categories[1].m_size = 0;
  block_categories[1].m_capacity = 0;
  block_categories[0].m_p = (uint *)0x0;
  block_categories[0].m_size = 0;
  block_categories[0].m_capacity = 0;
  vector<unsigned_int>::reserve(block_categories,0x800);
  vector<unsigned_int>::reserve(block_categories + 1,0x800);
  uVar15 = 0;
  while (((uVar15 < *(uint *)(*pData_ptr + 8) && (this->m_canceled == false)) &&
         (((char)uVar15 != '\0' ||
          ((cVar7 = crn_get_current_thread_id(), cVar7 != this->m_main_thread_id ||
           (bVar4 = update_progress(this,(uint)uVar15,*(int *)(*pData_ptr + 8) - 1), bVar4))))))) {
    uVar1 = this->m_pTask_pool->m_num_threads;
    if ((uVar1 == 0) ||
       (local_88 = (int)data, (int)((uVar15 & 0xffffffff) % (ulong)(uVar1 + 1)) == local_88)) {
      lVar8 = **pData_ptr;
      if (1 < *(uint *)(lVar8 + 8 + uVar15 * 0x10)) {
        vector<unsigned_int>::resize(block_categories,0,false);
        vector<unsigned_int>::resize(block_categories + 1,0,false);
        plVar13 = (long *)(lVar8 + uVar15 * 0x10);
        for (uVar16 = 0; uVar16 < *(uint *)(plVar13 + 1); uVar16 = uVar16 + 1) {
          block_index = *(uint *)(*plVar13 + uVar16 * 4);
          uVar5 = block_index * this->m_elements_per_block;
          vector<unsigned_int>::push_back
                    (block_categories +
                     (this->m_pDst_elements[uVar5].m_endpoints[0] <=
                     this->m_pDst_elements[uVar5].m_endpoints[1]),&block_index);
        }
        blk.m_endpoints[0] = '\0';
        blk.m_endpoints[1] = '\0';
        blk.m_selectors[0] = '\0';
        blk.m_selectors[1] = '\0';
        blk.m_selectors[2] = '\0';
        blk.m_selectors[3] = '\0';
        blk.m_selectors[4] = '\0';
        blk.m_selectors[5] = '\0';
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          if (1 < block_categories[lVar8].m_size) {
            for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
              for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
                uVar16 = 0;
                uVar9 = 0xffffffffff;
                for (uVar17 = 0; uVar17 != 8; uVar17 = uVar17 + 1) {
                  uVar14 = 0;
                  for (uVar12 = 0; uVar12 < block_categories[lVar8].m_size; uVar12 = uVar12 + 1) {
                    uVar5 = block_categories[lVar8].m_p[uVar12];
                    pdVar2 = this->m_pBlocks;
                    uVar11 = this->m_elements_per_block * uVar5;
                    dxt5_block::get_block_values
                              (&block_index,(uint)this->m_pDst_elements[uVar11].m_endpoints[0],
                               (uint)this->m_pDst_elements[uVar11].m_endpoints[1]);
                    iVar6 = (uint)pdVar2[uVar5].m_pixels[lVar10][lVar18].field_0.c
                                  [(this->m_params).m_comp_index] - (&block_index)[uVar17];
                    uVar14 = uVar14 + (uint)(iVar6 * iVar6);
                  }
                  if (uVar14 < uVar9) {
                    uVar16 = uVar17 & 0xffffffff;
                    uVar9 = uVar14;
                  }
                }
                dxt5_block::set_selector(&blk,(uint)lVar18,(uint)lVar10,(uint)uVar16);
              }
            }
            for (uVar16 = 0; uVar16 < block_categories[lVar8].m_size; uVar16 = uVar16 + 1) {
              pdVar3 = this->m_pDst_elements;
              uVar5 = this->m_elements_per_block * block_categories[lVar8].m_p[uVar16];
              *(undefined2 *)(pdVar3[uVar5].m_selectors + 4) = blk.m_selectors._4_2_;
              *(undefined4 *)pdVar3[uVar5].m_selectors = blk.m_selectors._0_4_;
            }
          }
        }
      }
    }
    uVar15 = uVar15 + 1;
  }
  lVar8 = 0x10;
  do {
    vector<unsigned_int>::~vector((vector<unsigned_int> *)((long)&block_categories[0].m_p + lVar8));
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -0x10);
  return;
}

Assistant:

void qdxt5::optimize_selectors_task(uint64 data, void* pData_ptr)
    {
        const uint thread_index = static_cast<uint>(data);

        optimize_selectors_params& task_params = *static_cast<optimize_selectors_params*>(pData_ptr);

        crnlib::vector<uint> block_categories[2];
        block_categories[0].reserve(2048);
        block_categories[1].reserve(2048);

        for (uint cluster_index = 0; cluster_index < task_params.m_selector_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & 255) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, task_params.m_selector_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& selector_indices = task_params.m_selector_cluster_indices[cluster_index];

            if (selector_indices.size() <= 1)
            {
                continue;
            }

            block_categories[0].resize(0);
            block_categories[1].resize(0);

            for (uint block_iter = 0; block_iter < selector_indices.size(); block_iter++)
            {
                const uint block_index = selector_indices[block_iter];

                const dxt5_block& src_block = get_block(block_index);

                block_categories[src_block.is_alpha6_block()].push_back(block_index);
            }

            dxt5_block blk;
            utils::zero_object(blk);

            for (uint block_type = 0; block_type <= 1; block_type++)
            {
                const crnlib::vector<uint>& block_indices = block_categories[block_type];
                if (block_indices.size() <= 1)
                {
                    continue;
                }

                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        uint best_s = 0;
                        uint64 best_error = 0xFFFFFFFFFFULL;

                        for (uint s = 0; s < dxt5_block::cMaxSelectorValues; s++)
                        {
                            uint64 total_error = 0;

                            for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                            {
                                const uint block_index = block_indices[block_iter];

                                const color_quad_u8& orig_color = m_pBlocks[block_index].m_pixels[y][x];

                                const dxt5_block& dst_block = get_block(block_index);

                                uint values[dxt5_block::cMaxSelectorValues];
                                dxt5_block::get_block_values(values, dst_block.get_low_alpha(), dst_block.get_high_alpha());

                                int error = math::square((int)orig_color[m_params.m_comp_index] - (int)values[s]);

                                total_error += error;
                            }

                            if (total_error < best_error)
                            {
                                best_error = total_error;
                                best_s = s;
                            }
                        }

                        blk.set_selector(x, y, best_s);

                    } // x
                } // y

                for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                {
                    const uint block_index = block_indices[block_iter];

                    dxt5_block& dst_block = get_block(block_index);

                    memcpy(dst_block.m_selectors, blk.m_selectors, sizeof(dst_block.m_selectors));
                }
            }

        } // cluster_index
    }